

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_multi_statemach(connectdata *conn,_Bool *done)

{
  smtp_conn *smtpc;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  if ((((conn->handler->flags & 1) == 0) || (((conn->proto).imapc.ssldone & 1U) != 0)) ||
     ((conn_local._4_4_ = Curl_ssl_connect_nonblocking(conn,0,&(conn->proto).imapc.ssldone),
      conn_local._4_4_ == CURLE_OK && (((conn->proto).imapc.ssldone & 1U) != 0)))) {
    conn_local._4_4_ = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
    *done = (conn->proto).imapc.state == IMAP_STOP;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_multi_statemach(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  if((conn->handler->flags & PROTOPT_SSL) && !smtpc->ssldone) {
    result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &smtpc->ssldone);
    if(result || !smtpc->ssldone)
      return result;
  }

  result = Curl_pp_statemach(&smtpc->pp, FALSE);
  *done = (smtpc->state == SMTP_STOP) ? TRUE : FALSE;

  return result;
}